

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O1

void __thiscall
duckdb::BatchedBufferedData::BlockSink
          (BatchedBufferedData *this,InterruptState *blocked_sink,idx_t batch)

{
  mutex *__mutex;
  int iVar1;
  idx_t local_20;
  
  __mutex = &(this->super_BufferedData).glock;
  local_20 = batch;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    ::std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::InterruptState>,std::_Select1st<std::pair<unsigned_long_const,duckdb::InterruptState>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::InterruptState>>>
    ::_M_emplace_unique<unsigned_long&,duckdb::InterruptState_const&>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::InterruptState>,std::_Select1st<std::pair<unsigned_long_const,duckdb::InterruptState>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::InterruptState>>>
                *)&this->blocked_sinks,&local_20,blocked_sink);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void BatchedBufferedData::BlockSink(const InterruptState &blocked_sink, idx_t batch) {
	lock_guard<mutex> lock(glock);
	D_ASSERT(!blocked_sinks.count(batch));
	blocked_sinks.emplace(batch, blocked_sink);
}